

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TagModuleField::~TagModuleField(TagModuleField *this)

{
  TagModuleField *this_local;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__TagModuleField_00353b68;
  Tag::~Tag(&this->tag);
  ModuleFieldMixin<(wabt::ModuleFieldType)10>::~ModuleFieldMixin
            (&this->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>);
  return;
}

Assistant:

explicit TagModuleField(const Location& loc = Location(),
                          std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::Tag>(loc), tag(name) {}